

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O2

bool tinyusdz::tydra::anon_unknown_0::MeshVisitor
               (Path *abs_path,Prim *prim,int32_t level,void *userdata,string *err)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pPVar3;
  Stage *pSVar4;
  GeomSubset *this;
  RenderSceneConverter *pRVar5;
  bool bVar6;
  mapped_type *this_00;
  ulong val;
  Path *pPVar7;
  GeomMesh *mesh;
  MaterialPath *this_01;
  Prim *child;
  pointer this_02;
  pointer ppGVar8;
  string *err_local;
  MeshVisitorEnv *visitorEnv;
  allocator local_7b1;
  Path *local_7b0;
  string local_7a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_788;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_780;
  anon_class_16_2_91e644f1 ConvertBoundMaterial;
  string backface_purpose;
  MaterialPath material_path;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6d8;
  _Alloc_hider local_6c8;
  size_type local_6c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6b8;
  _Alloc_hider local_6a8;
  size_type local_6a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_698;
  bool local_688;
  storage_t<tinyusdz::Path::PathType> local_684;
  bool local_680;
  vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
  material_subsets;
  int64_t rmaterial_id;
  Material *bound_material;
  Prim *local_620;
  GeomMesh *local_618;
  pointer local_610;
  int64_t rmaterial_id_1;
  pointer ppStack_600;
  pointer local_5f8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::MaterialPath,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::MaterialPath>_>_>
  subset_material_path_map;
  GeomSubset *psubset;
  string local_598 [40];
  string local_570 [32];
  Path subset_abs_path;
  
  err_local = err;
  local_7b0 = abs_path;
  if ((userdata == (void *)0x0) || (visitorEnv = (MeshVisitorEnv *)userdata, 0x100000 < level)) {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::append((char *)err);
    }
LAB_002a059e:
    bVar6 = false;
  }
  else {
    local_618 = Prim::as<tinyusdz::GeomMesh>(prim);
    if (local_618 != (GeomMesh *)0x0) {
      bVar6 = TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
              ::authored(&local_618->points);
      if (!bVar6) {
        return true;
      }
      ConvertBoundMaterial.visitorEnv = &visitorEnv;
      subset_material_path_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &subset_material_path_map._M_t._M_impl.super__Rb_tree_header._M_header;
      subset_material_path_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      subset_material_path_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      subset_material_path_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      material_subsets.
      super__Vector_base<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      material_path.material_path.field_2._M_allocated_capacity = 0;
      material_subsets.
      super__Vector_base<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      material_subsets.
      super__Vector_base<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      material_path.material_path._M_dataplus._M_p = (pointer)0x0;
      material_path.material_path._M_string_length = 0;
      pPVar3 = (prim->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      ConvertBoundMaterial.err = &err_local;
      local_620 = prim;
      subset_material_path_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           subset_material_path_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      for (this_02 = (prim->_children).
                     super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                     super__Vector_impl_data._M_start; this_02 != pPVar3; this_02 = this_02 + 1) {
        psubset = Prim::as<tinyusdz::GeomSubset>(this_02);
        if (psubset != (GeomSubset *)0x0) {
          subset_abs_path._prim_part._M_dataplus._M_p = (pointer)&subset_abs_path._prim_part.field_2
          ;
          subset_abs_path._prim_part._M_string_length = 0;
          subset_abs_path._prim_part.field_2._M_local_buf[0] = '\0';
          bVar6 = TypedAttribute<tinyusdz::Token>::get_value
                            (&psubset->familyName,(Token *)&subset_abs_path);
          if ((bVar6) &&
             (bVar6 = ::std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&subset_abs_path,"materialBind"), !bVar6)) {
            ::std::
            vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>::
            push_back((vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
                       *)&material_path,&psubset);
          }
          ::std::__cxx11::string::_M_dispose();
        }
      }
      ::std::vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>::
      _M_move_assign(&material_subsets,(Path *)&material_path);
      ::std::
      _Vector_base<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>::
      ~_Vector_base((_Vector_base<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
                     *)&material_path);
      local_610 = material_subsets.
                  super__Vector_base<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      local_780 = &local_6b8;
      local_788 = &local_698;
      for (ppGVar8 = material_subsets.
                     super__Vector_base<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
                     ._M_impl.super__Vector_impl_data._M_start; ppGVar8 != local_610;
          ppGVar8 = ppGVar8 + 1) {
        MaterialPath::MaterialPath((MaterialPath *)&psubset);
        ::std::__cxx11::string::_M_assign(local_570);
        Path::AppendElement(&subset_abs_path,local_7b0,&(*ppGVar8)->name);
        material_path.material_path._M_dataplus._M_p = (pointer)&material_path.material_path.field_2
        ;
        material_path.material_path._M_string_length = 0;
        material_path.material_path.field_2._M_allocated_capacity =
             material_path.material_path.field_2._M_allocated_capacity & 0xffffffffffffff00;
        material_path.backface_material_path._M_dataplus._M_p =
             (pointer)&material_path.backface_material_path.field_2;
        material_path.backface_material_path._M_string_length = 0;
        material_path.backface_material_path.field_2._M_local_buf[0] = '\0';
        material_path._64_8_ = &material_path.default_texcoords_primvar_name._M_string_length;
        material_path.default_texcoords_primvar_name._M_dataplus._M_p = (pointer)0x0;
        material_path.default_texcoords_primvar_name._M_string_length._0_1_ = 0;
        material_path.default_texcoords_primvar_name.field_2._8_8_ = &local_6d8;
        local_6d8._M_local_buf[0] = '\0';
        local_6c8._M_p = (pointer)local_780;
        local_6c0 = 0;
        local_6b8._M_local_buf[0] = '\0';
        local_6a8._M_p = (pointer)local_788;
        local_6a0 = 0;
        local_698._M_local_buf[0] = '\0';
        local_688 = false;
        local_684 = (storage_t<tinyusdz::Path::PathType>)0x0;
        bound_material = (Material *)0x0;
        local_680 = false;
        pSVar4 = visitorEnv->env->stage;
        ::std::__cxx11::string::string((string *)&backface_purpose,"",(allocator *)&local_7a8);
        bVar6 = GetBoundMaterial(pSVar4,&subset_abs_path,&backface_purpose,(Path *)&material_path,
                                 &bound_material,err_local);
        ::std::__cxx11::string::_M_dispose();
        if (bound_material != (Material *)0x0 && bVar6) {
          rmaterial_id = -1;
          bVar6 = MeshVisitor::anon_class_16_2_91e644f1::operator()
                            (&ConvertBoundMaterial,(Path *)&material_path,bound_material,
                             &rmaterial_id);
          if (bVar6) {
            Path::full_path_name_abi_cxx11_(&backface_purpose,(Path *)&material_path);
            ::std::__cxx11::string::operator=((string *)&psubset,(string *)&backface_purpose);
            ::std::__cxx11::string::_M_dispose();
            goto LAB_002a0913;
          }
          if (err_local != (string *)0x0) {
            Path::full_path_name_abi_cxx11_(&local_7a8,(Path *)&material_path);
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &backface_purpose,"Convert boundMaterial failed: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_7a8);
            ::std::__cxx11::string::append((string *)err_local);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          Path::~Path((Path *)&material_path);
LAB_002a12a6:
          Path::~Path(&subset_abs_path);
          this_01 = (MaterialPath *)&psubset;
          goto LAB_002a12bb;
        }
LAB_002a0913:
        Path::~Path((Path *)&material_path);
        ::std::__cxx11::string::string
                  ((string *)&backface_purpose,(string *)&visitorEnv->env->material_config);
        if (backface_purpose._M_string_length != 0) {
          this = *ppGVar8;
          Token::Token((Token *)&material_path,&backface_purpose);
          bVar6 = MaterialBinding::has_materialBinding
                            (&this->super_MaterialBinding,(token *)&material_path);
          ::std::__cxx11::string::_M_dispose();
          if (bVar6) {
            material_path.material_path._M_dataplus._M_p =
                 (pointer)&material_path.material_path.field_2;
            material_path.material_path._M_string_length = 0;
            material_path.material_path.field_2._M_allocated_capacity =
                 material_path.material_path.field_2._M_allocated_capacity & 0xffffffffffffff00;
            material_path.backface_material_path._M_dataplus._M_p =
                 (pointer)&material_path.backface_material_path.field_2;
            material_path.backface_material_path._M_string_length = 0;
            material_path.backface_material_path.field_2._M_local_buf[0] = '\0';
            material_path._64_8_ = &material_path.default_texcoords_primvar_name._M_string_length;
            material_path.default_texcoords_primvar_name._M_dataplus._M_p = (pointer)0x0;
            material_path.default_texcoords_primvar_name._M_string_length._0_1_ = 0;
            material_path.default_texcoords_primvar_name.field_2._8_8_ = &local_6d8;
            local_6d8._M_local_buf[0] = '\0';
            local_6c8._M_p = (pointer)local_780;
            local_6c0 = 0;
            local_6b8._M_local_buf[0] = '\0';
            local_6a8._M_p = (pointer)local_788;
            local_6a0 = 0;
            local_698._M_local_buf[0] = '\0';
            local_688 = false;
            local_684 = (storage_t<tinyusdz::Path::PathType>)0x0;
            local_680 = false;
            rmaterial_id = 0;
            bVar6 = GetBoundMaterial(visitorEnv->env->stage,&subset_abs_path,
                                     &(visitorEnv->env->material_config).
                                      default_backface_material_purpose_name,(Path *)&material_path,
                                     (Material **)&rmaterial_id,err_local);
            if (rmaterial_id != 0 && bVar6) {
              rmaterial_id_1 = -1;
              bVar6 = MeshVisitor::anon_class_16_2_91e644f1::operator()
                                (&ConvertBoundMaterial,(Path *)&material_path,
                                 (Material *)rmaterial_id,&rmaterial_id_1);
              if (!bVar6) {
                if (err_local != (string *)0x0) {
                  Path::full_path_name_abi_cxx11_((string *)&bound_material,(Path *)&material_path);
                  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&local_7a8,"Convert boundMaterial failed: ",
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&bound_material);
                  ::std::__cxx11::string::append((string *)err_local);
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                }
                Path::~Path((Path *)&material_path);
                ::std::__cxx11::string::_M_dispose();
                goto LAB_002a12a6;
              }
              Path::full_path_name_abi_cxx11_(&local_7a8,(Path *)&material_path);
              ::std::__cxx11::string::operator=(local_598,(string *)&local_7a8);
              ::std::__cxx11::string::_M_dispose();
            }
            Path::~Path((Path *)&material_path);
          }
        }
        this_00 = ::std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::MaterialPath,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::MaterialPath>_>_>
                  ::operator[](&subset_material_path_map,&(*ppGVar8)->name);
        MaterialPath::operator=(this_00,(MaterialPath *)&psubset);
        ::std::__cxx11::string::_M_dispose();
        Path::~Path(&subset_abs_path);
        MaterialPath::~MaterialPath((MaterialPath *)&psubset);
      }
      MaterialPath::MaterialPath(&material_path);
      ::std::__cxx11::string::_M_assign((string *)&material_path.default_texcoords_primvar_name);
      pPVar7 = local_7b0;
      Path::full_path_name_abi_cxx11_((string *)&psubset,local_7b0);
      paVar1 = &subset_abs_path._prop_part.field_2;
      subset_abs_path._prim_part._M_dataplus._M_p = (pointer)&subset_abs_path._prim_part.field_2;
      subset_abs_path._prim_part._M_string_length = 0;
      subset_abs_path._prim_part.field_2._M_local_buf[0] = '\0';
      subset_abs_path._prop_part._M_string_length = 0;
      subset_abs_path._prop_part.field_2._M_local_buf[0] = '\0';
      subset_abs_path._variant_part._M_dataplus._M_p =
           (pointer)&subset_abs_path._variant_part.field_2;
      subset_abs_path._variant_part._M_string_length = 0;
      subset_abs_path._variant_part.field_2._M_local_buf[0] = '\0';
      subset_abs_path._variant_selection_part._M_dataplus._M_p =
           (pointer)&subset_abs_path._variant_selection_part.field_2;
      subset_abs_path._variant_selection_part._M_string_length = 0;
      subset_abs_path._variant_selection_part.field_2._M_local_buf[0] = '\0';
      subset_abs_path._variant_part_str._M_dataplus._M_p =
           (pointer)&subset_abs_path._variant_part_str.field_2;
      subset_abs_path._variant_part_str._M_string_length = 0;
      subset_abs_path._variant_part_str.field_2._M_local_buf[0] = '\0';
      paVar2 = &subset_abs_path._element.field_2;
      subset_abs_path._element._M_string_length = 0;
      subset_abs_path._element.field_2._M_local_buf[0] = '\0';
      subset_abs_path._path_type.has_value_ = false;
      subset_abs_path._path_type.contained = (storage_t<tinyusdz::Path::PathType>)0x0;
      bound_material = (Material *)0x0;
      subset_abs_path._valid = false;
      pSVar4 = visitorEnv->env->stage;
      subset_abs_path._prop_part._M_dataplus._M_p = (pointer)paVar1;
      subset_abs_path._element._M_dataplus._M_p = (pointer)paVar2;
      ::std::__cxx11::string::string((string *)&backface_purpose,"",(allocator *)&local_7a8);
      bVar6 = GetBoundMaterial(pSVar4,pPVar7,&backface_purpose,&subset_abs_path,&bound_material,
                               err_local);
      ::std::__cxx11::string::_M_dispose();
      mesh = local_618;
      if (bound_material != (Material *)0x0 && bVar6) {
        rmaterial_id = -1;
        bVar6 = MeshVisitor::anon_class_16_2_91e644f1::operator()
                          (&ConvertBoundMaterial,&subset_abs_path,bound_material,&rmaterial_id);
        if (!bVar6) {
          if (err_local != (string *)0x0) {
            Path::full_path_name_abi_cxx11_(&local_7a8,&subset_abs_path);
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &backface_purpose,"Convert boundMaterial failed: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_7a8);
            ::std::__cxx11::string::append((string *)err_local);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          Path::~Path(&subset_abs_path);
          ::std::__cxx11::string::_M_dispose();
          this_01 = &material_path;
LAB_002a12bb:
          MaterialPath::~MaterialPath(this_01);
          ::std::
          _Vector_base<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
          ::~_Vector_base(&material_subsets.
                           super__Vector_base<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
                         );
          ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::MaterialPath>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::MaterialPath>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::MaterialPath>_>_>
          ::~_Rb_tree(&subset_material_path_map._M_t);
          goto LAB_002a059e;
        }
        Path::full_path_name_abi_cxx11_(&backface_purpose,&subset_abs_path);
        ::std::__cxx11::string::operator=((string *)&material_path,(string *)&backface_purpose);
        ::std::__cxx11::string::_M_dispose();
      }
      Path::~Path(&subset_abs_path);
      ::std::__cxx11::string::string
                ((string *)&backface_purpose,(string *)&visitorEnv->env->material_config);
      if (backface_purpose._M_string_length == 0) {
LAB_002a0e6f:
        rmaterial_id_1 = 0;
        ppStack_600 = (pointer)0x0;
        local_5f8 = (pointer)0x0;
        pPVar7 = &subset_abs_path;
        subset_abs_path._prim_part._M_dataplus._M_p = (pointer)&subset_abs_path._prim_part.field_2;
        subset_abs_path._prim_part._M_string_length = 0;
        subset_abs_path._prim_part.field_2._M_local_buf[0] = '\0';
        GetBlendShapes((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
                        *)&local_7a8,visitorEnv->env->stage,local_620,(string *)pPVar7);
        ::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
        ::_M_move_assign((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
                          *)&rmaterial_id_1,&local_7a8);
        ::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
                   *)&local_7a8);
        if ((subset_abs_path._prim_part._M_string_length != 0) && (err_local != (string *)0x0)) {
          ::std::__cxx11::string::string
                    ((string *)&bound_material,"Failed to get BlendShapes prims. err = {}",
                     (allocator *)&rmaterial_id);
          fmt::format<std::__cxx11::string>
                    ((string *)&local_7a8,(fmt *)&bound_material,&subset_abs_path._prim_part,
                     &pPVar7->_prim_part);
          ::std::__cxx11::string::append((string *)err_local);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
        }
        ::std::__cxx11::string::_M_dispose();
        RenderMesh::RenderMesh((RenderMesh *)&subset_abs_path);
        bVar6 = RenderSceneConverter::ConvertMesh
                          (visitorEnv->converter,visitorEnv->env,local_7b0,mesh,&material_path,
                           &subset_material_path_map,&visitorEnv->converter->materialMap,
                           &material_subsets,
                           (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
                            *)&rmaterial_id_1,(RenderMesh *)&subset_abs_path);
        if (bVar6) {
          pRVar5 = visitorEnv->converter;
          val = ((long)(pRVar5->meshes).
                       super__Vector_base<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(pRVar5->meshes).
                      super__Vector_base<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x520;
          if (0x7ffffffe < val) {
            if (err_local != (string *)0x0) {
              ::std::__cxx11::string::append((char *)err_local);
            }
            goto LAB_002a11d4;
          }
          Path::full_path_name_abi_cxx11_(&local_7a8,local_7b0);
          StringAndIdMap::add(&pRVar5->meshMap,&local_7a8,val);
          ::std::__cxx11::string::_M_dispose();
          ::std::vector<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>::
          emplace_back<tinyusdz::tydra::RenderMesh>
                    (&visitorEnv->converter->meshes,(RenderMesh *)&subset_abs_path);
          bVar6 = true;
        }
        else {
          if (err_local != (string *)0x0) {
            ::std::__cxx11::string::string
                      ((string *)&bound_material,"Mesh conversion failed: {}",&local_7b1);
            Path::full_path_name_abi_cxx11_((string *)&rmaterial_id,local_7b0);
            fmt::format<std::__cxx11::string>
                      ((string *)&local_7a8,(fmt *)&bound_material,(string *)&rmaterial_id,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)mesh);
            ::std::__cxx11::string::append((string *)err_local);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &bound_material,"\n",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &visitorEnv->converter->_err);
            ::std::operator+(&local_7a8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &bound_material,"\n");
            ::std::__cxx11::string::append((string *)err_local);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
LAB_002a11d4:
          bVar6 = false;
        }
        RenderMesh::~RenderMesh((RenderMesh *)&subset_abs_path);
        ::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
                   *)&rmaterial_id_1);
      }
      else {
        Token::Token((Token *)&subset_abs_path,&backface_purpose);
        bVar6 = MaterialBinding::has_materialBinding
                          (&(mesh->super_GPrim).super_MaterialBinding,(token *)&subset_abs_path);
        ::std::__cxx11::string::_M_dispose();
        if (!bVar6) goto LAB_002a0e6f;
        subset_abs_path._prim_part._M_dataplus._M_p = (pointer)&subset_abs_path._prim_part.field_2;
        subset_abs_path._prim_part._M_string_length = 0;
        subset_abs_path._prim_part.field_2._M_local_buf[0] = '\0';
        subset_abs_path._prop_part._M_string_length = 0;
        subset_abs_path._prop_part.field_2._M_local_buf[0] = '\0';
        subset_abs_path._variant_part._M_dataplus._M_p =
             (pointer)&subset_abs_path._variant_part.field_2;
        subset_abs_path._variant_part._M_string_length = 0;
        subset_abs_path._variant_part.field_2._M_local_buf[0] = '\0';
        subset_abs_path._variant_selection_part._M_dataplus._M_p =
             (pointer)&subset_abs_path._variant_selection_part.field_2;
        subset_abs_path._variant_selection_part._M_string_length = 0;
        subset_abs_path._variant_selection_part.field_2._M_local_buf[0] = '\0';
        subset_abs_path._variant_part_str._M_dataplus._M_p =
             (pointer)&subset_abs_path._variant_part_str.field_2;
        subset_abs_path._variant_part_str._M_string_length = 0;
        subset_abs_path._variant_part_str.field_2._M_local_buf[0] = '\0';
        subset_abs_path._element._M_string_length = 0;
        subset_abs_path._element.field_2._M_local_buf[0] = '\0';
        subset_abs_path._path_type.has_value_ = false;
        subset_abs_path._path_type.contained = (storage_t<tinyusdz::Path::PathType>)0x0;
        subset_abs_path._valid = false;
        rmaterial_id = 0;
        subset_abs_path._prop_part._M_dataplus._M_p = (pointer)paVar1;
        subset_abs_path._element._M_dataplus._M_p = (pointer)paVar2;
        bVar6 = GetBoundMaterial(visitorEnv->env->stage,local_7b0,
                                 &(visitorEnv->env->material_config).
                                  default_backface_material_purpose_name,&subset_abs_path,
                                 (Material **)&rmaterial_id,err_local);
        if (rmaterial_id == 0 || !bVar6) {
LAB_002a0e62:
          Path::~Path(&subset_abs_path);
          goto LAB_002a0e6f;
        }
        rmaterial_id_1 = -1;
        bVar6 = MeshVisitor::anon_class_16_2_91e644f1::operator()
                          (&ConvertBoundMaterial,&subset_abs_path,(Material *)rmaterial_id,
                           &rmaterial_id_1);
        if (bVar6) {
          Path::full_path_name_abi_cxx11_(&local_7a8,&subset_abs_path);
          ::std::__cxx11::string::operator=
                    ((string *)&material_path.backface_material_path,(string *)&local_7a8);
          ::std::__cxx11::string::_M_dispose();
          goto LAB_002a0e62;
        }
        if (err_local != (string *)0x0) {
          Path::full_path_name_abi_cxx11_((string *)&bound_material,&subset_abs_path);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_7a8,"Convert boundMaterial failed: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &bound_material);
          ::std::__cxx11::string::append((string *)err_local);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
        }
        Path::~Path(&subset_abs_path);
        bVar6 = false;
      }
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      MaterialPath::~MaterialPath(&material_path);
      ::std::
      _Vector_base<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>::
      ~_Vector_base(&material_subsets.
                     super__Vector_base<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
                   );
      ::std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::MaterialPath>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::MaterialPath>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::MaterialPath>_>_>
      ::~_Rb_tree(&subset_material_path_map._M_t);
      if (!bVar6) goto LAB_002a059e;
    }
    bVar6 = true;
  }
  return bVar6;
}

Assistant:

bool MeshVisitor(const tinyusdz::Path &abs_path, const tinyusdz::Prim &prim,
                 const int32_t level, void *userdata, std::string *err) {
  if (!userdata) {
    if (err) {
      (*err) += "userdata pointer must be filled.";
    }
    return false;
  }

  MeshVisitorEnv *visitorEnv = reinterpret_cast<MeshVisitorEnv *>(userdata);

  if (level > 1024 * 1024) {
    if (err) {
      (*err) += "Scene graph is too deep.\n";
    }
    // Too deep
    return false;
  }

  if (const tinyusdz::GeomMesh *pmesh = prim.as<tinyusdz::GeomMesh>()) {
    // Collect GeomSubsets
    // std::vector<const tinyusdz::GeomSubset *> subsets = GetGeomSubsets(;

    DCOUT("Mesh: " << abs_path);

    if (!pmesh->points.authored()) {
      // Maybe Collider mesh? Ignore for now.
      DCOUT(fmt::format("Mesh {} does not author `points` attribute(Maybe Collider mesh?). Ignore it for now", abs_path));
      return true;
    }

    //
    // First convert Material assigned to GeomMesh.
    //
    // - If prim has GeomSubset with materialBind, convert it to per-face
    // material.
    // - If prim has materialBind, convert it to RenderMesh's material.
    //

    auto ConvertBoundMaterial = [&](const Path &bound_material_path,
                                    const tinyusdz::Material *bound_material,
                                    int64_t &rmaterial_id) -> bool {
      std::vector<RenderMaterial> &rmaterials =
          visitorEnv->converter->materials;

      const auto matIt = visitorEnv->converter->materialMap.find(
          bound_material_path.full_path_name());

      if (matIt != visitorEnv->converter->materialMap.s_end()) {
        // Got material in the cache.
        uint64_t mat_id = matIt->second;
        if (mat_id >= visitorEnv->converter->materials
                          .size()) {  // this should not happen though
          if (err) {
            (*err) += "Material index out-of-range.\n";
          }
          return false;
        }

        if (mat_id >= size_t((std::numeric_limits<int32_t>::max)())) {
          if (err) {
            (*err) += "Material index too large.\n";
          }
          return false;
        }

        rmaterial_id = int64_t(mat_id);

      } else {
        RenderMaterial rmat;
        if (!visitorEnv->converter->ConvertMaterial(*visitorEnv->env,
                                                    bound_material_path,
                                                    *bound_material, &rmat)) {
          if (err) {
            (*err) += fmt::format("Material conversion failed: {}",
                                  bound_material_path);
          }
          return false;
        }

        // Assign new material ID
        uint64_t mat_id = rmaterials.size();

        if (mat_id >= uint64_t((std::numeric_limits<int32_t>::max)())) {
          if (err) {
            (*err) += "Material index too large.\n";
          }
          return false;
        }
        rmaterial_id = int64_t(mat_id);

        visitorEnv->converter->materialMap.add(
            bound_material_path.full_path_name(), uint64_t(rmaterial_id));
        DCOUT("Added renderMaterial: " << mat_id << " " << rmat.abs_path
                                       << " ( " << rmat.name << " ) ");

        rmaterials.push_back(rmat);
      }

      return true;
    };

    // Convert bound materials in GeomSubsets
    //
    // key: subset Prim name
    std::map<std::string, MaterialPath> subset_material_path_map;
    std::vector<const GeomSubset *> material_subsets;
    {
      material_subsets = GetMaterialBindGeomSubsets(prim);

      for (const auto &psubset : material_subsets) {
        MaterialPath mpath;
        mpath.default_texcoords_primvar_name =
            visitorEnv->env->mesh_config.default_texcoords_primvar_name;

        Path subset_abs_path = abs_path.AppendElement(psubset->name);

        // front and back
        {
          tinyusdz::Path bound_material_path;
          const tinyusdz::Material *bound_material{nullptr};
          bool ret = tinyusdz::tydra::GetBoundMaterial(
              visitorEnv->env->stage,
              /* GeomSubset prim path */ subset_abs_path,
              /* purpose */ "", &bound_material_path, &bound_material, err);

          if (ret && bound_material) {
            int64_t rmaterial_id = -1;  // not used.

            if (!ConvertBoundMaterial(bound_material_path, bound_material,
                                      rmaterial_id)) {
              if (err) {
                (*err) += "Convert boundMaterial failed: " + bound_material_path.full_path_name();
              }
              return false;
            }

            mpath.material_path = bound_material_path.full_path_name();
            DCOUT("GeomSubset " << subset_abs_path << " : Bound material path: "
                                << mpath.backface_material_path);
          }
        }

        std::string backface_purpose =
            visitorEnv->env->material_config
                .default_backface_material_purpose_name;

        if (!backface_purpose.empty() &&
            psubset->has_materialBinding(value::token(backface_purpose))) {
          DCOUT("backface_material_purpose "
                << visitorEnv->env->material_config
                       .default_backface_material_purpose_name);
          tinyusdz::Path bound_material_path;
          const tinyusdz::Material *bound_material{nullptr};
          bool ret = tinyusdz::tydra::GetBoundMaterial(
              visitorEnv->env->stage,
              /* GeomSubset prim path */ subset_abs_path,
              /* purpose */
              visitorEnv->env->material_config
                  .default_backface_material_purpose_name,
              &bound_material_path, &bound_material, err);

          if (ret && bound_material) {
            int64_t rmaterial_id = -1;  // not used

            if (!ConvertBoundMaterial(bound_material_path, bound_material,
                                      rmaterial_id)) {
              if (err) {
                (*err) += "Convert boundMaterial failed: " + bound_material_path.full_path_name();
              }
              return false;
            }

            mpath.backface_material_path = bound_material_path.full_path_name();
            DCOUT("GeomSubset " << subset_abs_path
                                << " : Bound backface material path: "
                                << mpath.backface_material_path);
          }
        }

        subset_material_path_map[psubset->name] = mpath;
      }
    }

    MaterialPath material_path;
    material_path.default_texcoords_primvar_name =
        visitorEnv->env->mesh_config.default_texcoords_primvar_name;
    // TODO: Implement feature to assign default material
    // id(MaterialPath::default_material_id) when no bound material found.

    {
      const std::string mesh_path_str = abs_path.full_path_name();

      // Front and back material.
      {
        tinyusdz::Path bound_material_path;
        const tinyusdz::Material *bound_material{nullptr};
        bool ret = tinyusdz::tydra::GetBoundMaterial(
            visitorEnv->env->stage, /* GeomMesh prim path */ abs_path,
            /* purpose */ "", &bound_material_path, &bound_material, err);

        if (ret && bound_material) {
          int64_t rmaterial_id = -1;  // not used

          if (!ConvertBoundMaterial(bound_material_path, bound_material,
                                    rmaterial_id)) {
            if (err) {
              (*err) += "Convert boundMaterial failed: " + bound_material_path.full_path_name();
            }
            return false;
          }

          material_path.material_path = bound_material_path.full_path_name();
          DCOUT("Bound material path: " << material_path.material_path);
        }
      }

      std::string backface_purpose =
          visitorEnv->env->material_config
              .default_backface_material_purpose_name;

      if (!backface_purpose.empty() &&
          pmesh->has_materialBinding(value::token(backface_purpose))) {
        tinyusdz::Path bound_material_path;
        const tinyusdz::Material *bound_material{nullptr};
        bool ret = tinyusdz::tydra::GetBoundMaterial(
            visitorEnv->env->stage, /* GeomMesh prim path */ abs_path,
            /* purpose */
            visitorEnv->env->material_config
                .default_backface_material_purpose_name,
            &bound_material_path, &bound_material, err);

        if (ret && bound_material) {
          int64_t rmaterial_id = -1;  // not used

          if (!ConvertBoundMaterial(bound_material_path, bound_material,
                                    rmaterial_id)) {
            if (err) {
              (*err) += "Convert boundMaterial failed: " + bound_material_path.full_path_name();
            }
            return false;
          }

          material_path.backface_material_path =
              bound_material_path.full_path_name();
          DCOUT("Bound backface material path: "
                << material_path.backface_material_path);
        }
      }

      // BlendShapes
      std::vector<std::pair<std::string, const BlendShape *>> blendshapes;
      {
        std::string local_err;
        blendshapes = GetBlendShapes(visitorEnv->env->stage, prim, &local_err);
        if (local_err.size()) {
          if (err) {
            (*err) += fmt::format("Failed to get BlendShapes prims. err = {}", local_err);
          }
        }
      }
      DCOUT("# of blendshapes : " << blendshapes.size());

      RenderMesh rmesh;

      if (!visitorEnv->converter->ConvertMesh(
              *visitorEnv->env, abs_path, *pmesh, material_path,
              subset_material_path_map, visitorEnv->converter->materialMap,
              material_subsets, blendshapes, &rmesh)) {
        if (err) {
          (*err) += fmt::format("Mesh conversion failed: {}",
                                abs_path.full_path_name());
          (*err) += "\n" + visitorEnv->converter->GetError() + "\n";

        }
        return false;
      }

      uint64_t mesh_id = uint64_t(visitorEnv->converter->meshes.size());
      if (mesh_id >= size_t((std::numeric_limits<int32_t>::max)())) {
        if (err) {
          (*err) += "Mesh index too large.\n";
        }
        return false;
      }
      visitorEnv->converter->meshMap.add(abs_path.full_path_name(), mesh_id);

      visitorEnv->converter->meshes.emplace_back(std::move(rmesh));
    }
  }

  return true;  // continue traversal
}